

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypt.c
# Opt level: O0

void gen_e(uchar *e)

{
  int iVar1;
  uint32_t uVar2;
  long in_RDI;
  uchar val [64];
  uchar mask;
  uint16_t ind [128];
  uint16_t ind_ [128];
  int count;
  int eq;
  int j;
  int i;
  unsigned_long_long in_stack_fffffffffffffd98;
  uchar *in_stack_fffffffffffffda0;
  ushort auStack_218 [128];
  ushort local_118 [128];
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = in_RDI;
  do {
    do {
      randombytes(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      for (local_c = 0; local_c < 0x80; local_c = local_c + 1) {
        local_118[local_c] = local_118[local_c] & 0xfff;
      }
      local_18 = 0;
      for (local_c = 0; iVar1 = local_18, local_c < 0x80; local_c = local_c + 1) {
        if (local_118[local_c] < 0xda0) {
          local_18 = local_18 + 1;
          auStack_218[iVar1] = local_118[local_c];
        }
      }
    } while (local_18 < 0x40);
    local_14 = 0;
    for (local_c = 1; local_c < 0x40; local_c = local_c + 1) {
      for (local_10 = 0; local_10 < local_c; local_10 = local_10 + 1) {
        if (auStack_218[local_c] == auStack_218[local_10]) {
          local_14 = 1;
        }
      }
    }
  } while (local_14 != 0);
  for (local_10 = 0; local_10 < 0x40; local_10 = local_10 + 1) {
    (&stack0xfffffffffffffd98)[local_10] = (char)(1 << ((byte)auStack_218[local_10] & 7));
  }
  for (local_c = 0; local_c < 0x1b4; local_c = local_c + 1) {
    *(undefined1 *)(local_8 + local_c) = 0;
    for (local_10 = 0; local_10 < 0x40; local_10 = local_10 + 1) {
      uVar2 = same_mask((uint16_t)local_c,(uint16_t)((int)(uint)auStack_218[local_10] >> 3));
      *(byte *)(local_8 + local_c) =
           *(byte *)(local_8 + local_c) | (&stack0xfffffffffffffd98)[local_10] & (byte)uVar2;
    }
  }
  return;
}

Assistant:

void gen_e(unsigned char *e)
{
	int i, j, eq, count;

	uint16_t ind_[ SYS_T*2 ];
	uint16_t ind[ SYS_T*2 ];
	unsigned char mask;	
	unsigned char val[ SYS_T ];	

	while (1)
	{
		randombytes((unsigned char *) ind_, sizeof(ind_));

		for (i = 0; i < SYS_T*2; i++)
			ind_[i] &= GFMASK;

		// moving and counting indices in the correct range

		count = 0;
		for (i = 0; i < SYS_T*2; i++)
			if (ind_[i] < SYS_N)
				ind[ count++ ] = ind_[i];
		
		if (count < SYS_T) continue;

		// check for repetition

		eq = 0;

		for (i = 1; i < SYS_T; i++) for (j = 0; j < i; j++)
			if (ind[i] == ind[j]) 
				eq = 1;

		if (eq == 0)
			break;
	}

	for (j = 0; j < SYS_T; j++)
		val[j] = 1 << (ind[j] & 7);

	for (i = 0; i < SYS_N/8; i++) 
	{
		e[i] = 0;

		for (j = 0; j < SYS_T; j++)
		{
			mask = same_mask(i, (ind[j] >> 3));

			e[i] |= val[j] & mask;
		}
	}
}